

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineLargeContiguousImpl64
                   (uint64_t state,uchar *first,size_t len)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  uint64_t uVar3;
  undefined8 local_50;
  size_t len_local;
  uchar *first_local;
  uint64_t state_local;
  MultType m;
  
  local_50 = len;
  len_local = (size_t)first;
  first_local = (uchar *)state;
  while( true ) {
    sVar2 = PiecewiseChunkSize();
    if (local_50 < sVar2) break;
    sVar2 = PiecewiseChunkSize();
    uVar3 = LowLevelHashImpl((uchar *)len_local,sVar2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)first_local ^ uVar3;
    first_local = (uchar *)(SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0) ^
                           SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8));
    sVar2 = PiecewiseChunkSize();
    local_50 = local_50 - sVar2;
    sVar2 = PiecewiseChunkSize();
    len_local = sVar2 + len_local;
  }
  uVar3 = CombineContiguousImpl(first_local,len_local,local_50);
  return uVar3;
}

Assistant:

uint64_t MixingHashState::CombineLargeContiguousImpl64(
    uint64_t state, const unsigned char* first, size_t len) {
  while (len >= PiecewiseChunkSize()) {
    state = Mix(state ^ Hash64(first, PiecewiseChunkSize()), kMul);
    len -= PiecewiseChunkSize();
    first += PiecewiseChunkSize();
  }
  // Handle the remainder.
  return CombineContiguousImpl(state, first, len,
                               std::integral_constant<int, 8>{});
}